

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::SamHeaderValidator::AddWarning(SamHeaderValidator *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&WARN_PREFIX_abi_cxx11_,message);
  std::operator+(&local_50,&local_30,&NEWLINE_abi_cxx11_);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_warningMessages,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SamHeaderValidator::AddWarning(const std::string& message)
{
    m_warningMessages.push_back(WARN_PREFIX + message + NEWLINE);
}